

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::Functions::GetComponent<tcu::Vector<float,_4>_>::print
          (GetComponent<tcu::Vector<float,_4>_> *this,ostream *os,BaseArgExprs *args)

{
  ExprBase *pEVar1;
  
  (*(*(args->
      super__Vector_base<const_vkt::shaderexecutor::ExprBase_*,_std::allocator<const_vkt::shaderexecutor::ExprBase_*>_>
      )._M_impl.super__Vector_impl_data._M_start)->_vptr_ExprBase[2])();
  std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
  pEVar1 = (args->
           super__Vector_base<const_vkt::shaderexecutor::ExprBase_*,_std::allocator<const_vkt::shaderexecutor::ExprBase_*>_>
           )._M_impl.super__Vector_impl_data._M_start[1];
  (*pEVar1->_vptr_ExprBase[2])(pEVar1,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
  return;
}

Assistant:

void		print		(ostream&				os,
							 const BaseArgExprs&	args) const
	{
		os << *args[0] << "[" << *args[1] << "]";
	}